

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O1

void r4mat_print_some(int m,int n,float *a,int ilo,int jlo,int ihi,int jhi,string *title)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ostream *poVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  float *pfVar9;
  uint uVar10;
  ulong uVar11;
  float *local_70;
  ulong local_50;
  float *local_48;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(title->_M_dataplus)._M_p,title->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  if (0 < n && 0 < m) {
    if (jlo <= jhi) {
      lVar8 = (long)jlo;
      uVar6 = (ulong)(uint)m;
      local_50 = lVar8 - 1;
      local_70 = a + local_50 * uVar6 + -1;
      do {
        iVar1 = (int)lVar8;
        iVar2 = i4_min(iVar1 + 4,n);
        iVar2 = i4_min(iVar2,jhi);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Col:    ",10);
        if (iVar1 <= iVar2) {
          uVar11 = local_50 & 0xffffffff;
          do {
            *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 7;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)uVar11);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,"       ",7);
            uVar10 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar10;
          } while ((int)uVar10 < iVar2);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  Row\n",6);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
        iVar3 = i4_max(ilo,1);
        iVar4 = i4_min(ihi,m);
        if (iVar3 <= iVar4) {
          lVar7 = (long)iVar3;
          local_48 = local_70 + lVar7;
          do {
            *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 5;
            poVar5 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,(int)lVar7 + -1);
            std::__ostream_insert<char,std::char_traits<char>>(poVar5,": ",2);
            pfVar9 = local_48;
            uVar11 = local_50;
            if (iVar1 <= iVar2) {
              do {
                *(undefined8 *)(fesetround + *(long *)(std::cout + -0x18)) = 0xc;
                poVar5 = std::ostream::_M_insert<double>((double)*pfVar9);
                std::__ostream_insert<char,std::char_traits<char>>(poVar5,"  ",2);
                uVar11 = uVar11 + 1;
                pfVar9 = pfVar9 + uVar6;
              } while ((long)uVar11 < (long)iVar2);
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
            lVar7 = lVar7 + 1;
            local_48 = local_48 + 1;
          } while (iVar4 + 1 != (int)lVar7);
        }
        lVar8 = lVar8 + 5;
        local_50 = local_50 + 5;
        local_70 = local_70 + uVar6 * 5;
      } while ((int)lVar8 <= jhi);
    }
    return;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"  (None)\n",9);
  return;
}

Assistant:

void r4mat_print_some ( int m, int n, float a[], int ilo, int jlo, int ihi,
  int jhi, string title )

//****************************************************************************80
//
//  Purpose:
//
//    R4MAT_PRINT_SOME prints some of an R4MAT.
//
//  Discussion:
//
//    An R4MAT is a doubly dimensioned array of R4 values, stored as a vector
//    in column-major order.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    20 August 2010
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, int M, the number of rows of the matrix.
//    M must be positive.
//
//    Input, int N, the number of columns of the matrix.
//    N must be positive.
//
//    Input, float A[M*N], the matrix.
//
//    Input, int ILO, JLO, IHI, JHI, designate the first row and
//    column, and the last row and column to be printed.
//
//    Input, string TITLE, a title.
//
{
# define INCX 5

  int i;
  int i2hi;
  int i2lo;
  int j;
  int j2hi;
  int j2lo;

  cout << "\n";
  cout << title << "\n";

  if ( m <= 0 || n <= 0 )
  {
    cout << "\n";
    cout << "  (None)\n";
    return;
  }
//
//  Print the columns of the matrix, in strips of 5.
//
  for ( j2lo = jlo; j2lo <= jhi; j2lo = j2lo + INCX )
  {
    j2hi = j2lo + INCX - 1;
    j2hi = i4_min ( j2hi, n );
    j2hi = i4_min ( j2hi, jhi );

    cout << "\n";
//
//  For each column J in the current range...
//
//  Write the header.
//
    cout << "  Col:    ";
    for ( j = j2lo; j <= j2hi; j++ )
    {
      cout << setw(7) << j - 1 << "       ";
    }
    cout << "\n";
    cout << "  Row\n";
    cout << "\n";
//
//  Determine the range of the rows in this strip.
//
    i2lo = i4_max ( ilo, 1 );
    i2hi = i4_min ( ihi, m );

    for ( i = i2lo; i <= i2hi; i++ )
    {
//
//  Print out (up to) 5 entries in row I, that lie in the current strip.
//
      cout << setw(5) << i - 1 << ": ";
      for ( j = j2lo; j <= j2hi; j++ )
      {
        cout << setw(12) << a[i-1+(j-1)*m] << "  ";
      }
      cout << "\n";
    }
  }

  return;
# undef INCX
}